

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Exception::~Exception(Exception *this)

{
  Exception *this_local;
  
  ~Exception(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

Exception::~Exception() noexcept = default;